

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

void Saig_ManCbaShrink(Saig_ManCba_t *p)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Vec_t *pVVar5;
  Aig_Man_t *pAVar6;
  int iVar7;
  int *piVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  pVVar5 = p->vReg2Frame;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar11];
      if (1 < *(int *)((long)pvVar3 + 4)) {
        lVar10 = 1;
        do {
          uVar1 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar10 * 4);
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar2 = *(uint *)(*(long *)((long)pvVar3 + 8) + -4 + lVar10 * 4);
          pVVar4 = p->pFrames->vObjs;
          if (pVVar4 == (Vec_Ptr_t *)0x0) {
            pvVar9 = (void *)0x0;
          }
          else {
            if (pVVar4->nSize <= (int)(uVar1 >> 1)) goto LAB_0060d925;
            pvVar9 = pVVar4->pArray[uVar1 >> 1];
          }
          if (pvVar9 != (void *)0x0) {
            if (((ulong)pvVar9 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if ((((uint)*(ulong *)((long)pvVar9 + 0x18) & 7) == 1) ||
               (*(int *)((long)pvVar9 + 0x20) == p->pFrames->nTravIds)) {
              pAVar6 = p->pAig;
              pVVar4 = pAVar6->vObjs;
              if (pVVar4 == (Vec_Ptr_t *)0x0) {
                piVar8 = (int *)0x0;
              }
              else {
                if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
LAB_0060d925:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                piVar8 = (int *)pVVar4->pArray[uVar2];
              }
              if (((piVar8[6] & 7U) != 3) || (*piVar8 < pAVar6->nTruePos)) {
                __assert_fail("Saig_ObjIsLi(p->pAig, pObjLi)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldCex.c"
                              ,0x23a,"void Saig_ManCbaShrink(Saig_ManCba_t *)");
              }
              iVar7 = *piVar8 - pAVar6->nTruePos;
              if (iVar7 < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              Vec_VecPushInt(p->vReg2Value,(int)lVar11,
                             ((uint)((*(ulong *)((long)pvVar9 + 0x18) & 8) == 0) ^ uVar1 & 1) +
                             iVar7 * 2);
            }
          }
          lVar10 = lVar10 + 2;
        } while ((int)lVar10 < *(int *)((long)pvVar3 + 4));
      }
      lVar11 = lVar11 + 1;
      pVVar5 = p->vReg2Frame;
    } while (lVar11 < pVVar5->nSize);
  }
  pVVar5 = p->vReg2Frame;
  if (0 < pVVar5->nSize) {
    uVar12 = 0;
    do {
      if ((long)p->vReg2Value->nSize <= (long)uVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      dVar13 = (double)p->pAig->nRegs;
      printf("Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n",
             ((double)(*(int *)((long)pVVar5->pArray[uVar12] + 4) / 2) * 100.0) / dVar13,
             ((double)*(int *)((long)p->vReg2Value->pArray[uVar12] + 4) * 100.0) / dVar13,
             uVar12 & 0xffffffff);
      uVar12 = uVar12 + 1;
      pVVar5 = p->vReg2Frame;
    } while ((long)uVar12 < (long)pVVar5->nSize);
  }
  pAVar6 = Saig_ManDupWithCubes(p->pAig,p->vReg2Value);
  Aig_ManStop(pAVar6);
  return;
}

Assistant:

void Saig_ManCbaShrink( Saig_ManCba_t * p )
{
    Aig_Man_t * pManNew;
    Aig_Obj_t * pObjLi, * pObjFrame;
    Vec_Int_t * vLevel, * vLevel2;
    int f, k, ObjId, Lit;
    // assuming that important objects are labeled in Saig_ManCbaFindReason()
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, f )
    {
        Vec_IntForEachEntryDouble( vLevel, ObjId, Lit, k )
        {
            pObjFrame = Aig_ManObj( p->pFrames, Abc_Lit2Var(Lit) );
            if ( pObjFrame == NULL || (!Aig_ObjIsConst1(pObjFrame) && !Aig_ObjIsTravIdCurrent(p->pFrames, pObjFrame)) )
                continue;
            pObjLi = Aig_ManObj( p->pAig, ObjId );
            assert( Saig_ObjIsLi(p->pAig, pObjLi) );
            Vec_VecPushInt( p->vReg2Value, f, Abc_Var2Lit( Aig_ObjCioId(pObjLi) - Saig_ManPoNum(p->pAig), Abc_LitIsCompl(Lit) ^ !pObjFrame->fPhase ) );
        }
    }
    // print statistics
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, k )
    {
        vLevel2 = Vec_VecEntryInt( p->vReg2Value, k );
        printf( "Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n", k, 
            Vec_IntSize(vLevel)/2, 100.0 * (Vec_IntSize(vLevel)/2) / Aig_ManRegNum(p->pAig),
            Vec_IntSize(vLevel2),  100.0 * Vec_IntSize(vLevel2) / Aig_ManRegNum(p->pAig) );
    }
    // try reducing the frames
    pManNew = Saig_ManDupWithCubes( p->pAig, p->vReg2Value );
//    Ioa_WriteAiger( pManNew, "aigcube.aig", 0, 0 );
    Aig_ManStop( pManNew );
}